

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ctmbstr tidyOptGetNextDeclTag(TidyDoc tdoc,TidyOptionId optId,TidyIterator *iter)

{
  undefined4 local_34;
  ctmbstr ptStack_30;
  UserTagType tagtyp;
  ctmbstr tagnam;
  TidyDocImpl *impl;
  TidyIterator *iter_local;
  TidyOptionId optId_local;
  TidyDoc tdoc_local;
  
  ptStack_30 = (ctmbstr)0x0;
  if (tdoc != (TidyDoc)0x0) {
    local_34 = tagtype_null;
    if (optId == TidyInlineTags) {
      local_34 = tagtype_inline;
    }
    else if (optId == TidyBlockTags) {
      local_34 = tagtype_block;
    }
    else if (optId == TidyEmptyTags) {
      local_34 = tagtype_empty;
    }
    else if (optId == TidyPreTags) {
      local_34 = tagtype_pre;
    }
    if (local_34 != tagtype_null) {
      ptStack_30 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,local_34,iter);
    }
  }
  return ptStack_30;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetNextDeclTag( TidyDoc tdoc, TidyOptionId optId,
                                     TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr tagnam = NULL;
    if ( impl )
    {
        UserTagType tagtyp = tagtype_null;
        if ( optId == TidyInlineTags )
            tagtyp = tagtype_inline;
        else if ( optId == TidyBlockTags )
            tagtyp = tagtype_block;
        else if ( optId == TidyEmptyTags )
            tagtyp = tagtype_empty;
        else if ( optId == TidyPreTags )
            tagtyp = tagtype_pre;
        if ( tagtyp != tagtype_null )
            tagnam = TY_(GetNextDeclaredTag)( impl, tagtyp, iter );
    }
    return tagnam;
}